

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMain.h
# Opt level: O0

void __thiscall MinVR::VRParseCommandLine::noParsing(VRParseCommandLine *this)

{
  long in_RDI;
  
  std::__cxx11::string::operator=((string *)(in_RDI + 0x28),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x48),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x68),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x88),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0xa8),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 200),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0xe8),"");
  return;
}

Assistant:

void noParsing() {
    _setConfigValueShort = "";
    _setConfigValueLong = "";
    _loadConfigShort = "";
    _loadConfigLong = "";
    _helpShort = "";
    _helpLong = "";
    _noExecute = "";
  }